

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O1

void __thiscall ipx::Iterate::Iterate(Iterate *this,Model *model)

{
  int iVar1;
  double *pdVar2;
  pointer pSVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double dVar9;
  size_t sVar10;
  ulong uVar11;
  int iVar12;
  ulong __new_size;
  
  this->model_ = model;
  memset(&this->x_,0,0x102);
  this->feasibility_tol_ = 1e-06;
  this->optimality_tol_ = 1e-08;
  this->start_crossover_tol_ = -1.0;
  iVar1 = model->num_rows_;
  sVar10 = (size_t)iVar1;
  __new_size = (long)model->num_cols_ + sVar10;
  if ((this->x_)._M_size != __new_size) {
    operator_delete((this->x_)._M_data);
    (this->x_)._M_size = __new_size;
    pdVar8 = (double *)operator_new(__new_size * 8);
    (this->x_)._M_data = pdVar8;
  }
  iVar12 = (int)__new_size;
  if (iVar12 != 0) {
    memset((this->x_)._M_data,0,__new_size * 8);
  }
  if ((this->xl_)._M_size != __new_size) {
    operator_delete((this->xl_)._M_data);
    (this->xl_)._M_size = __new_size;
    pdVar8 = (double *)operator_new(__new_size * 8);
    (this->xl_)._M_data = pdVar8;
  }
  if (iVar12 != 0) {
    memset((this->xl_)._M_data,0,__new_size * 8);
  }
  if ((this->xu_)._M_size != __new_size) {
    operator_delete((this->xu_)._M_data);
    (this->xu_)._M_size = __new_size;
    pdVar8 = (double *)operator_new(__new_size * 8);
    (this->xu_)._M_data = pdVar8;
  }
  if (iVar12 != 0) {
    memset((this->xu_)._M_data,0,__new_size * 8);
  }
  if ((this->y_)._M_size != sVar10) {
    operator_delete((this->y_)._M_data);
    (this->y_)._M_size = sVar10;
    pdVar8 = (double *)operator_new(sVar10 * 8);
    (this->y_)._M_data = pdVar8;
  }
  if (iVar1 != 0) {
    memset((this->y_)._M_data,0,sVar10 * 8);
  }
  if ((this->zl_)._M_size != __new_size) {
    operator_delete((this->zl_)._M_data);
    (this->zl_)._M_size = __new_size;
    pdVar8 = (double *)operator_new(__new_size * 8);
    (this->zl_)._M_data = pdVar8;
  }
  if (iVar12 != 0) {
    memset((this->zl_)._M_data,0,__new_size * 8);
  }
  if ((this->zu_)._M_size != __new_size) {
    operator_delete((this->zu_)._M_data);
    (this->zu_)._M_size = __new_size;
    pdVar8 = (double *)operator_new(__new_size * 8);
    (this->zu_)._M_data = pdVar8;
  }
  if (iVar12 != 0) {
    memset((this->zu_)._M_data,0,__new_size * 8);
  }
  if ((this->rb_)._M_size != sVar10) {
    operator_delete((this->rb_)._M_data);
    (this->rb_)._M_size = sVar10;
    pdVar8 = (double *)operator_new(sVar10 * 8);
    (this->rb_)._M_data = pdVar8;
  }
  if (iVar1 != 0) {
    memset((this->rb_)._M_data,0,sVar10 << 3);
  }
  if ((this->rl_)._M_size != __new_size) {
    operator_delete((this->rl_)._M_data);
    (this->rl_)._M_size = __new_size;
    pdVar8 = (double *)operator_new(__new_size * 8);
    (this->rl_)._M_data = pdVar8;
  }
  if (iVar12 != 0) {
    memset((this->rl_)._M_data,0,__new_size * 8);
  }
  if ((this->ru_)._M_size != __new_size) {
    operator_delete((this->ru_)._M_data);
    (this->ru_)._M_size = __new_size;
    pdVar8 = (double *)operator_new(__new_size * 8);
    (this->ru_)._M_data = pdVar8;
  }
  if (iVar12 != 0) {
    memset((this->ru_)._M_data,0,__new_size * 8);
  }
  if ((this->rc_)._M_size != __new_size) {
    operator_delete((this->rc_)._M_data);
    (this->rc_)._M_size = __new_size;
    pdVar8 = (double *)operator_new(__new_size * 8);
    (this->rc_)._M_data = pdVar8;
  }
  if (iVar12 != 0) {
    memset((this->rc_)._M_data,0,__new_size * 8);
  }
  std::vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>::resize
            (&this->variable_state_,__new_size);
  if (0 < iVar12) {
    pdVar8 = (model->lb_)._M_data;
    pdVar2 = (model->ub_)._M_data;
    pSVar3 = (this->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (this->xl_)._M_data;
    pdVar5 = (this->xu_)._M_data;
    pdVar6 = (this->zl_)._M_data;
    pdVar7 = (this->zu_)._M_data;
    uVar11 = 0;
    do {
      dVar9 = ABS(pdVar8[uVar11]);
      if ((ulong)dVar9 < 0x7ff0000000000000) {
        if ((ulong)ABS(pdVar2[uVar11]) < 0x7ff0000000000000) {
          pSVar3[uVar11] = BARRIER_BOXED;
          pdVar4[uVar11] = 1.0;
          pdVar5[uVar11] = 1.0;
          pdVar6[uVar11] = 1.0;
          goto LAB_003a42a2;
        }
        if (0x7fefffffffffffff < (ulong)dVar9) goto LAB_003a424b;
        pSVar3[uVar11] = BARRIER_LB;
        pdVar4[uVar11] = 1.0;
        pdVar5[uVar11] = INFINITY;
        pdVar6[uVar11] = 1.0;
        pdVar7[uVar11] = 0.0;
      }
      else {
LAB_003a424b:
        if ((ulong)ABS(pdVar2[uVar11]) < 0x7ff0000000000000) {
          pSVar3[uVar11] = BARRIER_UB;
          pdVar4[uVar11] = INFINITY;
          pdVar5[uVar11] = 1.0;
          pdVar6[uVar11] = 0.0;
LAB_003a42a2:
          pdVar7[uVar11] = 1.0;
        }
        else {
          pSVar3[uVar11] = FREE;
          pdVar4[uVar11] = INFINITY;
          pdVar5[uVar11] = INFINITY;
          pdVar6[uVar11] = 0.0;
          pdVar7[uVar11] = 0.0;
        }
      }
      uVar11 = uVar11 + 1;
    } while ((__new_size & 0xffffffff) != uVar11);
  }
  return;
}

Assistant:

Iterate::Iterate(const Model& model) : model_(model) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();
    x_.resize(n+m);
    xl_.resize(n+m);
    xu_.resize(n+m);
    y_.resize(m);
    zl_.resize(n+m);
    zu_.resize(n+m);
    rb_.resize(m);
    rl_.resize(n+m);
    ru_.resize(n+m);
    rc_.resize(n+m);
    variable_state_.resize(n+m);

    for (Int j = 0; j < n+m; j++) {
        if (std::isfinite(lb[j]) && std::isfinite(ub[j])) {
            variable_state_[j] = StateDetail::BARRIER_BOXED;
            xl_[j] = 1.0;
            xu_[j] = 1.0;
            zl_[j] = 1.0;
            zu_[j] = 1.0;
        } else if (std::isfinite(lb[j])) {
            variable_state_[j] = StateDetail::BARRIER_LB;
            xl_[j] = 1.0;
            xu_[j] = INFINITY;
            zl_[j] = 1.0;
            zu_[j] = 0.0;
        } else if (std::isfinite(ub[j])) {
            variable_state_[j] = StateDetail::BARRIER_UB;
            xl_[j] = INFINITY;
            xu_[j] = 1.0;
            zl_[j] = 0.0;
            zu_[j] = 1.0;
        } else {
            variable_state_[j] = StateDetail::FREE;
            xl_[j] = INFINITY;
            xu_[j] = INFINITY;
            zl_[j] = 0.0;
            zu_[j] = 0.0;
        }
    }
    assert_consistency();
}